

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O0

void connection_transmit_begin(apx_socketServerConnection_t *self)

{
  uint uVar1;
  apx_socketServerConnection_t *self_local;
  
  if (self != (apx_socketServerConnection_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    uVar1 = adt_bytearray_length(&self->send_buffer);
    if (uVar1 < self->default_buffer_size) {
      adt_bytearray_resize(&self->send_buffer,self->default_buffer_size);
    }
    self->pending_bytes = 0;
    uVar1 = adt_bytearray_length(&self->send_buffer);
    if (uVar1 < self->default_buffer_size) {
      __assert_fail("(adt_bytearray_length(&self->send_buffer) >= self->default_buffer_size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                    ,0x14f,"void connection_transmit_begin(apx_socketServerConnection_t *)");
    }
  }
  return;
}

Assistant:

static void connection_transmit_begin(apx_socketServerConnection_t* self)
{
   if (self != NULL)
   {
      MUTEX_LOCK(self->lock);
      if (adt_bytearray_length(&self->send_buffer) < self->default_buffer_size)
      {
         adt_bytearray_resize(&self->send_buffer, self->default_buffer_size);
      }
      self->pending_bytes = 0u;
      assert((adt_bytearray_length(&self->send_buffer) >= self->default_buffer_size));
   }
}